

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:542:60)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:542:60)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  global_object *this_00;
  long *plVar1;
  gc_heap_ptr<mjs::global_object> *this_01;
  gc_heap_ptr_untyped local_40;
  wstring_view local_30;
  
  if ((int)(this->f).version < 2) {
    this_01 = &(this->f).global;
    this_00 = (global_object *)gc_heap_ptr_untyped::get(&this_01->super_gc_heap_ptr_untyped);
    plVar1 = (long *)gc_heap_ptr_untyped::get(&this_01->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar1 + 0x70))(&local_40,plVar1);
    global_object::validate_type(this_00,this_,(object_ptr *)&local_40,"array");
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
  }
  if (this_->type_ == object) {
    local_30._M_len = 1;
    local_30._M_str = L",";
    anon_unknown_110::array_join((anon_unknown_110 *)&local_40,&(this_->field_1).o_,&local_30);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_40.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_40.pos_;
    if (local_40.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_40.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
    return __return_storage_ptr__;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }